

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint64_t helper_cksm(CPUS390XState_conflict *env,uint64_t r1,uint64_t src,uint64_t src_len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  uintptr_t unaff_retaddr;
  ulong local_50;
  ulong local_48;
  uint64_t cksm;
  uint64_t len;
  uint64_t max_len;
  uintptr_t ra;
  uint64_t src_len_local;
  uint64_t src_local;
  uint64_t r1_local;
  CPUS390XState_conflict *env_local;
  
  local_48 = r1 & 0xffffffff;
  local_50 = src_len;
  if (0x2000 < src_len) {
    local_50 = 0x2000;
  }
  src_len_local = src;
  for (cksm = 0; cksm + 4 <= local_50; cksm = cksm + 4) {
    uVar1 = cpu_ldl_data_ra_s390x(env,src_len_local,unaff_retaddr);
    local_48 = uVar1 + local_48;
    src_len_local = src_len_local + 4;
  }
  lVar3 = local_50 - cksm;
  if (lVar3 == 1) {
    uVar1 = cpu_ldub_data_ra_s390x(env,src_len_local,unaff_retaddr);
    local_48 = (uVar1 << 0x18) + local_48;
    cksm = cksm + 1;
  }
  else if (lVar3 == 2) {
    uVar1 = cpu_lduw_data_ra_s390x(env,src_len_local,unaff_retaddr);
    local_48 = (uVar1 << 0x10) + local_48;
    cksm = cksm + 2;
  }
  else if (lVar3 == 3) {
    uVar1 = cpu_lduw_data_ra_s390x(env,src_len_local,unaff_retaddr);
    uVar2 = cpu_ldub_data_ra_s390x(env,src_len_local + 2,unaff_retaddr);
    local_48 = (ulong)(uVar2 << 8) + (uVar1 << 0x10) + local_48;
    cksm = cksm + 3;
  }
  for (; 0xffffffff < local_48; local_48 = (local_48 & 0xffffffff) + (local_48 >> 0x20)) {
  }
  uVar1 = 3;
  if (cksm == src_len) {
    uVar1 = 0;
  }
  env->cc_op = uVar1;
  env->retxl = local_48;
  return cksm;
}

Assistant:

uint64_t HELPER(cksm)(CPUS390XState *env, uint64_t r1,
                      uint64_t src, uint64_t src_len)
{
    uintptr_t ra = GETPC();
    uint64_t max_len, len;
    uint64_t cksm = (uint32_t)r1;

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    max_len = (src_len > 0x2000 ? 0x2000 : src_len);

    /* Process full words as available.  */
    for (len = 0; len + 4 <= max_len; len += 4, src += 4) {
        cksm += (uint32_t)cpu_ldl_data_ra(env, src, ra);
    }

    switch (max_len - len) {
    case 1:
        cksm += cpu_ldub_data_ra(env, src, ra) << 24;
        len += 1;
        break;
    case 2:
        cksm += cpu_lduw_data_ra(env, src, ra) << 16;
        len += 2;
        break;
    case 3:
        cksm += cpu_lduw_data_ra(env, src, ra) << 16;
        cksm += cpu_ldub_data_ra(env, src + 2, ra) << 8;
        len += 3;
        break;
    }

    /* Fold the carry from the checksum.  Note that we can see carry-out
       during folding more than once (but probably not more than twice).  */
    while (cksm > 0xffffffffull) {
        cksm = (uint32_t)cksm + (cksm >> 32);
    }

    /* Indicate whether or not we've processed everything.  */
    env->cc_op = (len == src_len ? 0 : 3);

    /* Return both cksm and processed length.  */
    env->retxl = cksm;
    return len;
}